

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_pack.cpp
# Opt level: O1

char * libtorrent::name_for_setting(int s)

{
  qword *pqVar1;
  
  switch((uint)s >> 0xe & 3) {
  case 0:
    pqVar1 = &(anonymous_namespace)::str_settings + (long)s * 7;
    break;
  case 1:
    pqVar1 = &QWORD_004750a8 + (long)s * 4;
    break;
  case 2:
    pqVar1 = (qword *)("ses.num_incoming_dht_port" + (long)s * 0x20 + 0xe);
    break;
  case 3:
    return "";
  }
  return (char *)*pqVar1;
}

Assistant:

char const* name_for_setting(int s)
	{
		switch (s & settings_pack::type_mask)
		{
			case settings_pack::string_type_base:
				return str_settings[s - settings_pack::string_type_base].name;
			case settings_pack::int_type_base:
				return int_settings[s - settings_pack::int_type_base].name;
			case settings_pack::bool_type_base:
				return bool_settings[s - settings_pack::bool_type_base].name;
		}
		return "";
	}